

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaderparser.cpp
# Opt level: O0

bool ShaderParserParseRenderPass
               (string *prev_line,string *line,uint32_t current_char,uint32_t line_number,
               FErrorReport *report_error,RenderPass *pass)

{
  bool bVar1;
  undefined8 uVar2;
  allocator<char> local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  int local_e4;
  string local_e0 [4];
  int scanned;
  string args;
  uint32_t height;
  uint32_t width;
  char output [64];
  char input [64];
  RenderPass *pass_local;
  FErrorReport *report_error_local;
  uint32_t line_number_local;
  uint32_t current_char_local;
  string *line_local;
  string *prev_line_local;
  
  memset(output + 0x38,0,0x40);
  memset(&height,0,0x40);
  args.field_2._12_4_ = 0;
  args.field_2._8_4_ = 0;
  std::__cxx11::string::substr((ulong)local_e0,(ulong)prev_line);
  uVar2 = std::__cxx11::string::c_str();
  local_e4 = __isoc99_sscanf(uVar2,"(%[^,], %[^,], %d, %d)",&height,output + 0x38,
                             (undefined1 *)((long)&args.field_2 + 0xc),
                             (undefined1 *)((long)&args.field_2 + 8));
  if (local_e4 != 4) {
    args.field_2._8_4_ = 0;
    args.field_2._12_4_ = 0;
    memset(output + 0x38,0,0x40);
    memset(&height,0,0x40);
    uVar2 = std::__cxx11::string::c_str();
    local_e4 = __isoc99_sscanf(uVar2,"(%[^,], %d, %d)",&height,
                               (undefined1 *)((long)&args.field_2 + 0xc),
                               (undefined1 *)((long)&args.field_2 + 8));
    if (local_e4 != 3) {
      args.field_2._8_4_ = 0;
      args.field_2._12_4_ = 0;
      memset(output + 0x38,0,0x40);
      memset(&height,0,0x40);
      uVar2 = std::__cxx11::string::c_str();
      local_e4 = __isoc99_sscanf(uVar2,"(%[^,], %[^)])",&height,output + 0x38);
      if (local_e4 != 2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_108,
                   "Render pass format should be @pass(output, input, width, height), @pass(output, input) or @pass(output, width, height)"
                   ,&local_109);
        std::
        function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int)>
        ::operator()(report_error,&local_108,line_number);
        std::__cxx11::string::~string((string *)&local_108);
        std::allocator<char>::~allocator(&local_109);
        prev_line_local._7_1_ = false;
        goto LAB_00136030;
      }
    }
  }
  std::__cxx11::string::operator=((string *)&pass->Input,output + 0x38);
  std::__cxx11::string::operator=((string *)&pass->Output,(char *)&height);
  pass->Width = args.field_2._12_4_;
  pass->Height = args.field_2._8_4_;
  bVar1 = std::operator==(&pass->Output,"main");
  if (bVar1) {
    pass->IsMain = true;
  }
  prev_line_local._7_1_ = true;
LAB_00136030:
  std::__cxx11::string::~string(local_e0);
  return prev_line_local._7_1_;
}

Assistant:

bool ShaderParserParseRenderPass(const std::string& prev_line, const std::string& line, uint32_t current_char, uint32_t line_number, FErrorReport report_error, RenderPass& pass) {
    char input[64] = {0};
    char output[64] = {0};

    uint32_t width = 0;
    uint32_t height = 0;

    std::string args = prev_line.substr(current_char + 5, std::string::npos);

    int scanned = sscanf(args.c_str(), "(%[^,], %[^,], %d, %d)", output, input, &width, &height);
    if (scanned != 4) {
        width = height = 0;

        memset(input, 0x0, sizeof(input));
        memset(output, 0x0, sizeof(output));

        scanned = sscanf(args.c_str(), "(%[^,], %d, %d)", output, &width, &height);

        if (scanned != 3) {
            width = height = 0;

            memset(input, 0x0, sizeof(input));
            memset(output, 0x0, sizeof(output));

            scanned = sscanf(args.c_str(), "(%[^,], %[^)])", output, input);

            if (scanned != 2) {
                report_error("Render pass format should be @pass(output, input, width, height), @pass(output, input) or @pass(output, width, height)", line_number);
                return false;
            }
        }
    }

    pass.Input = input;
    pass.Output = output;
    pass.Width = width;
    pass.Height = height;

    if (pass.Output == "main") {
        pass.IsMain = true;
    }

    return true;
}